

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  char *bzr_status [4];
  OutputLogger err;
  StatusParser out;
  
  bzr_status[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  bzr_status[1] = "status";
  bzr_status[2] = "-SV";
  bzr_status[3] = (char *)0x0;
  StatusParser::StatusParser(&out,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,bzr_status,(OutputParser *)&out,(OutputParser *)&err,
                      (char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  StatusParser::~StatusParser(&out);
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_status[] = { bzr, "status", "-SV", nullptr };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}